

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.hpp
# Opt level: O2

void __thiscall
boost::python::
class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
::
def_impl<AbstractModuleClient,void(AbstractModuleClient::*)(std::__cxx11::string,unsigned_int),boost::python::detail::def_helper<void(PythonModuleClient::*)(std::__cxx11::string,unsigned_int),boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>>
          (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
           *this,AbstractModuleClient *param_1,char *name,first_type fn,
          def_helper<void_(PythonModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int),_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
          *helper,...)

{
  long in_R9;
  vector4<void,_AbstractModuleClient_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_39;
  object_base local_38;
  
  make_function<void(AbstractModuleClient::*)(std::__cxx11::string,unsigned_int),boost::python::default_call_policies,boost::python::detail::keywords<0ul>,boost::mpl::vector4<void,AbstractModuleClient&,std::__cxx11::string,unsigned_int>>
            ((first_type)&local_38,(default_call_policies *)fn,(keywords<0UL> *)helper,&local_39);
  objects::add_to_namespace((object *)this,name,(object *)&local_38,*(char **)(in_R9 + 0x30));
  api::object_base::~object_base(&local_38);
  def_default<void(AbstractModuleClient::*)(std::__cxx11::string,unsigned_int),boost::python::detail::def_helper<void(PythonModuleClient::*)(std::__cxx11::string,unsigned_int),boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>>
            (this,name,fn,helper,in_R9);
  return;
}

Assistant:

inline void def_impl(
        T*
      , char const* name
      , Fn fn
      , Helper const& helper
      , ...
    )
    {
        objects::add_to_namespace(
            *this
          , name
          , make_function(
                fn
              , helper.policies()
              , helper.keywords()
              , detail::get_signature(fn, (T*)0)
            )
          , helper.doc()
        );

        this->def_default(name, fn, helper, mpl::bool_<Helper::has_default_implementation>());
    }